

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)

{
  char16_t *string;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  char16_t **ppcVar4;
  size_t sVar5;
  StorageInfo *this;
  undefined4 *puVar6;
  char16 local_238 [4];
  char16 filename [260];
  StorageInfo *info;
  char16 *name;
  uint i;
  uint recordFreed;
  uint recordCount;
  bool deleteFileStorage_local;
  
  uVar3 = JsUtil::
          BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(&infoMap);
  name._4_4_ = 0;
  name._0_4_ = 0;
  do {
    if (uVar3 <= name._4_4_) {
      JsUtil::
      BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(&infoMap);
      return;
    }
    ppcVar4 = JsUtil::
              BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(&infoMap,(int)name);
    string = *ppcVar4;
    if (string != (char16_t *)0x0) {
      sVar5 = PAL_wcslen(string);
      Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t_const>
                ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar5 + 1,string);
      this = JsUtil::
             BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(&infoMap,(int)name);
      if ((this->isFileStorage & 1U) == 0) {
        DeleteRecord((this->field_1).record);
      }
      else {
        if ((useCacheDir & 1U) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x1dc,"(useCacheDir)","useCacheDir");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (deleteFileStorage) {
          StorageInfo::GetFilename(this,local_238);
          _wunlink(local_238);
        }
      }
      name._4_4_ = name._4_4_ + 1;
    }
    name._0_4_ = (int)name + 1;
  } while( true );
}

Assistant:

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)
{
    uint recordCount = infoMap.Count();
    uint recordFreed = 0;
    for (uint i = 0; recordFreed < recordCount; i++)
    {
        char16 const * name = infoMap.GetKeyAt(i);
        if (name == nullptr)
        {
            continue;
        }
        NoCheckHeapDeleteArray(wcslen(name) + 1, name);

        StorageInfo const& info = infoMap.GetValueAt(i);
        if (info.isFileStorage)
        {
            AssertOrFailFast(useCacheDir);
            if (deleteFileStorage)
            {
                char16 filename[_MAX_PATH];
                info.GetFilename(filename);
                _wunlink(filename);
            }
        }
        else
        {
            DeleteRecord(info.record);
        }

        recordFreed++;
    }
    infoMap.Clear();
}